

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> __thiscall
fmt::v8::detail::digit_grouping<char32_t>::
apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char>
          (digit_grouping<char32_t> *this,
          back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,
          basic_string_view<char> digits)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  char32_t cVar4;
  size_t sVar5;
  uint uVar6;
  byte *pbVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  ulong uVar12;
  undefined **local_828;
  undefined4 *local_820;
  long lStack_818;
  ulong local_810;
  undefined4 local_808 [502];
  
  uVar8 = digits.size_;
  local_820 = local_808;
  local_810 = 500;
  local_828 = &PTR_grow_001b28f0;
  local_808[0] = 0;
  pbVar10 = (byte *)(this->sep_).grouping._M_dataplus._M_p;
  iVar9 = 0;
  lStack_818 = 1;
  do {
    iVar11 = 0x7fffffff;
    if ((this->sep_).thousands_sep != L'\0') {
      pbVar7 = (byte *)((this->sep_).grouping._M_dataplus._M_p +
                       (this->sep_).grouping._M_string_length);
      if (pbVar10 == pbVar7) {
        uVar6 = (uint)(char)pbVar7[-1];
      }
      else {
        bVar2 = *pbVar10;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0016b290;
        pbVar10 = pbVar10 + 1;
        uVar6 = (uint)bVar2;
      }
      iVar11 = iVar9 + uVar6;
      iVar9 = iVar11;
    }
LAB_0016b290:
    uVar6 = (uint)digits.size_;
    if (iVar11 >= (int)uVar6 || iVar11 == 0) break;
    if (local_810 < lStack_818 + 1U) {
      (*(code *)*local_828)(&local_828);
    }
    lVar1 = lStack_818 + 1;
    local_820[lStack_818] = iVar11;
    lStack_818 = lVar1;
  } while (iVar11 < (int)uVar6 && iVar11 != 0);
  if (0 < (int)uVar6) {
    iVar9 = (int)lStack_818 + -1;
    uVar12 = 0;
    do {
      if ((int)uVar8 == local_820[iVar9]) {
        cVar4 = (this->sep_).thousands_sep;
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar5 = (out.container)->size_;
        (out.container)->size_ = sVar5 + 1;
        (out.container)->ptr_[sVar5] = cVar4;
        iVar9 = iVar9 + -1;
      }
      cVar3 = digits.data_[uVar12];
      if ((out.container)->capacity_ < (out.container)->size_ + 1) {
        (**(out.container)->_vptr_buffer)(out.container);
      }
      sVar5 = (out.container)->size_;
      (out.container)->size_ = sVar5 + 1;
      (out.container)->ptr_[sVar5] = (int)cVar3;
      uVar12 = uVar12 + 1;
      uVar8 = (ulong)((int)uVar8 - 1);
    } while ((uVar6 & 0x7fffffff) != uVar12);
  }
  if (local_820 != local_808) {
    operator_delete(local_820,local_810 << 2);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }